

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Designator_PDU.cpp
# Opt level: O1

KBOOL __thiscall KDIS::PDU::Designator_PDU::operator==(Designator_PDU *this,Designator_PDU *Value)

{
  KBOOL KVar1;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if ((((!KVar1) &&
       (KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                          (&this->m_DesignatingEntityID,&Value->m_DesignatingEntityID), !KVar1)) &&
      (this->m_ui16CodeName == Value->m_ui16CodeName)) &&
     ((KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                         (&this->m_DesignatedEntityID,&Value->m_DesignatedEntityID), !KVar1 &&
      (this->m_ui16Code == Value->m_ui16Code)))) {
    if (((float)this->m_f32Power == (float)Value->m_f32Power) &&
       (!NAN((float)this->m_f32Power) && !NAN((float)Value->m_f32Power))) {
      if (((((float)this->m_f32WaveLength == (float)Value->m_f32WaveLength) &&
           (!NAN((float)this->m_f32WaveLength) && !NAN((float)Value->m_f32WaveLength))) &&
          (KVar1 = DATA_TYPE::Vector::operator!=
                             (&this->m_SpotRegardsToEntity,&Value->m_SpotRegardsToEntity), !KVar1))
         && ((KVar1 = DATA_TYPE::WorldCoordinates::operator!=
                                (&this->m_SpotLocation,&Value->m_SpotLocation), !KVar1 &&
             (this->m_ui8DeadReckoningAlgorithm == Value->m_ui8DeadReckoningAlgorithm)))) {
        KVar1 = DATA_TYPE::Vector::operator!=
                          (&this->m_EntityLinearAcceleration,&Value->m_EntityLinearAcceleration);
        return !KVar1;
      }
    }
  }
  return false;
}

Assistant:

KBOOL Designator_PDU::operator == ( const Designator_PDU & Value ) const
{
    if( Header::operator             !=( Value ) )                          return false;
    if( m_DesignatingEntityID        != Value.m_DesignatingEntityID )       return false;
    if( m_ui16CodeName               != Value.m_ui16CodeName )              return false;
    if( m_DesignatedEntityID         != Value.m_DesignatedEntityID )        return false;
    if( m_ui16Code                   != Value.m_ui16Code )                  return false;
    if( m_f32Power                   != Value.m_f32Power )                  return false;
    if( m_f32WaveLength              != Value.m_f32WaveLength )             return false;
    if( m_SpotRegardsToEntity        != Value.m_SpotRegardsToEntity )       return false;
    if( m_SpotLocation               != Value.m_SpotLocation )              return false;
    if( m_ui8DeadReckoningAlgorithm  != Value.m_ui8DeadReckoningAlgorithm ) return false;
    if( m_EntityLinearAcceleration   != Value.m_EntityLinearAcceleration )  return false;
    return true;
}